

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O0

void JsToString(JsValue *val,JsValue *res)

{
  undefined4 uVar1;
  char *__s;
  undefined1 local_40 [8];
  JsValue prim;
  double value;
  char *buf;
  JsValue *res_local;
  JsValue *val_local;
  
  res->type = JS_STRING;
  switch(val->type) {
  case JS_UNDEFINED:
    (res->u).number = (double)"undefined";
    break;
  case JS_NULL:
    (res->u).number = (double)"null";
    break;
  case JS_BOOLEAN:
    if ((val->u).boolean == 1) {
      (res->u).number = (double)"true";
    }
    else {
      (res->u).number = (double)"false";
    }
    break;
  case JS_NUMBER:
    prim.u.reference.name = (char *)(val->u).number;
    __s = (char *)JsMalloc(0x80);
    if ((prim.u._8_8_ - (double)(int)prim.u._8_8_ != 0.0) ||
       (NAN(prim.u._8_8_ - (double)(int)prim.u._8_8_))) {
      sprintf(__s,"%f",prim.u.reference.name);
    }
    else {
      sprintf(__s,"%d",(ulong)(uint)(int)(double)prim.u.reference.name);
    }
    (res->u).string = __s;
    break;
  case JS_STRING:
    uVar1 = *(undefined4 *)&val->field_0x4;
    res->type = val->type;
    *(undefined4 *)&res->field_0x4 = uVar1;
    (res->u).number = (val->u).number;
    (res->u).reference.name = (val->u).reference.name;
    break;
  case JS_OBJECT:
    JsToPrimitive(val,0,(JsValue *)local_40);
    JsToString((JsValue *)local_40,res);
    break;
  default:
    JsThrowString("JsToStringError");
  }
  return;
}

Assistant:

void JsToString(struct JsValue *val, struct JsValue *res){
	
	res->type = JS_STRING;
	switch (val->type) {
	case JS_UNDEFINED:
		res->u.string = "undefined";
		break;
	case JS_NULL:
		res->u.string = "null";
		break;
	case JS_BOOLEAN:{
		if(val->u.boolean == TRUE)
			res->u.string ="true";
		else
			res->u.string = "false";
		break;
	}
	case JS_NUMBER:{					 /* 9.8.1 */
		char* buf;
		double value ;
		value = val->u.number;
		//最大长度为128位
		buf = (char*)JsMalloc(128);
		if(value - (int)value == 0){
			//整数
			sprintf(buf,"%d",(int)value);
		}else{
			sprintf(buf,"%f",value);
		}
		res->u.string = buf;
		break;
	}
	case JS_STRING:
		*res = *val;
		break;
	case JS_OBJECT:{
		struct JsValue prim;
		JsToPrimitive(val,JS_OBJECT_HIT_TYPE_STRING, &prim);
		JsToString(&prim, res);
		break;
	}
	default:
		JsThrowString("JsToStringError");
		
	}

}